

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.h
# Opt level: O2

pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *
anurbs::Triangle<3L>::closest_point
          (pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
           *__return_storage_ptr__,Vector *point,Vector *a,Vector *b,Vector *c)

{
  ResScalar RVar1;
  ResScalar RVar2;
  ResScalar RVar3;
  ResScalar RVar4;
  double r;
  double t;
  double s;
  Vector w;
  Vector v;
  Vector u;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double local_1d0;
  double dStack_1c8;
  double local_1c0;
  double local_1b8;
  double dStack_1b0;
  undefined1 local_1a8 [16];
  double local_198;
  type local_108;
  type local_e0;
  type local_b8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const>>
  local_90 [24];
  double local_78;
  RhsNested local_70;
  double local_50;
  RhsNested local_48;
  
  local_1a8._0_8_ = b;
  local_1a8._8_8_ = a;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_1c0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)local_1a8);
  local_1a8._0_8_ = c;
  local_1a8._8_8_ = a;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_1d8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)local_1a8);
  local_208 = dStack_1c8 * local_1b8 - dStack_1b0 * local_1d0;
  dStack_200 = local_1d8 * dStack_1b0 - local_1c0 * dStack_1c8;
  local_1f8 = local_1c0 * local_1d0 - local_1d8 * local_1b8;
  local_1a8._0_8_ = point;
  local_1a8._8_8_ = a;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_1f0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)local_1a8);
  local_1a8._0_8_ = dStack_1e0 * local_1b8 - dStack_1b0 * local_1e8;
  local_1a8._8_8_ = local_1f0 * dStack_1b0 - local_1c0 * dStack_1e0;
  local_198 = local_1c0 * local_1e8 - local_1f0 * local_1b8;
  RVar1 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_1a8,
                (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_208);
  RVar2 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_208,
                (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_208);
  local_1a8._0_8_ = dStack_1c8 * local_1e8 - dStack_1e0 * local_1d0;
  local_1a8._8_8_ = local_1d8 * dStack_1e0 - local_1f0 * dStack_1c8;
  local_198 = local_1f0 * local_1d0 - local_1d8 * local_1e8;
  local_220 = RVar1 / RVar2;
  RVar3 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_1a8,
                (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_208);
  RVar4 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_208,
                (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_208);
  local_210 = RVar3 / RVar4;
  local_218 = (1.0 - RVar1 / RVar2) - local_210;
  Eigen::operator*(&local_b8,&local_218,(StorageBaseType *)a);
  Eigen::operator*(&local_e0,&local_210,(StorageBaseType *)b);
  local_78 = local_b8.m_lhs.m_functor.m_other;
  local_70 = local_b8.m_rhs;
  local_50 = local_e0.m_lhs.m_functor.m_other;
  local_48 = local_e0.m_rhs;
  Eigen::operator*(&local_108,&local_220,(StorageBaseType *)c);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               *)local_1a8,local_90,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               *)&local_108);
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&__return_storage_ptr__->second,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
              *)local_1a8);
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] = local_218;
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[1] = local_210;
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[2] = local_220;
  return __return_storage_ptr__;
}

Assistant:

static std::pair<Parameter, Vector> closest_point(Vector point, Vector a, Vector b, Vector c)
    {
        Vector u = b - a;
        Vector v = c - a;
        Vector n = u.cross(v);
        Vector w = point - a;

        double r = u.cross(w).dot(n) / n.dot(n);
        double s = w.cross(v).dot(n) / n.dot(n);
        double t = 1.0 - r - s;

        Vector closest_point = t * a + s * b + r * c;

        return {Parameter(t, s, r), closest_point};
    }